

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O1

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  long local_90;
  undefined1 local_88 [16];
  long local_78 [13];
  
  uVar3 = uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,local_88);
  local_78[0] = (long)iVar1;
  if (local_78[0] == 0) {
    iVar1 = uv_tcp_init(uVar3,&tcp_handle);
    local_78[0] = (long)iVar1;
    if (local_78[0] != 0) goto LAB_001c9d78;
    iVar1 = uv_tcp_connect(local_78,&tcp_handle,local_88,connect_cb);
    if (iVar1 == -0x65) {
LAB_001c9d5e:
      run_test_tcp_close_while_connecting_cold_13();
      return 7;
    }
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9d85;
    iVar1 = uv_timer_init(uVar3,&timer1_handle);
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9d92;
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9d9f;
    iVar1 = uv_timer_init(uVar3,&timer2_handle);
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9dac;
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9db9;
    iVar1 = uv_run(uVar3,0);
    local_90 = 0;
    if (iVar1 != 0) goto LAB_001c9dc6;
    local_90 = (long)connect_cb_called;
    if (local_90 != 1) goto LAB_001c9dd3;
    local_90 = (long)timer1_cb_called;
    if (local_90 != 1) goto LAB_001c9de0;
    local_90 = (long)close_cb_called;
    if (local_90 == 2) {
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      iVar1 = uv_loop_close(uVar3);
      local_90 = (long)iVar1;
      if (local_90 == 0) {
        uv_library_shutdown();
        if (netunreach_errors < 1) {
          return 0;
        }
        goto LAB_001c9d5e;
      }
      goto LAB_001c9dfa;
    }
  }
  else {
    run_test_tcp_close_while_connecting_cold_1();
LAB_001c9d78:
    run_test_tcp_close_while_connecting_cold_2();
LAB_001c9d85:
    run_test_tcp_close_while_connecting_cold_3();
LAB_001c9d92:
    run_test_tcp_close_while_connecting_cold_4();
LAB_001c9d9f:
    run_test_tcp_close_while_connecting_cold_5();
LAB_001c9dac:
    run_test_tcp_close_while_connecting_cold_6();
LAB_001c9db9:
    run_test_tcp_close_while_connecting_cold_7();
LAB_001c9dc6:
    run_test_tcp_close_while_connecting_cold_8();
LAB_001c9dd3:
    run_test_tcp_close_while_connecting_cold_9();
LAB_001c9de0:
    run_test_tcp_close_while_connecting_cold_10();
  }
  run_test_tcp_close_while_connecting_cold_11();
LAB_001c9dfa:
  iVar1 = (int)&local_90;
  run_test_tcp_close_while_connecting_cold_12();
  if ((iVar1 != -0x7d) && (iVar1 != -0x65)) {
    connect_cb_cold_1();
    uv_close();
    iVar1 = uv_close(&tcp_handle,close_cb);
    timer1_cb_called = timer1_cb_called + 1;
    return iVar1;
  }
  iVar2 = uv_timer_stop(&timer2_handle);
  connect_cb_called = connect_cb_called + 1;
  if (iVar1 == -0x65) {
    netunreach_errors = netunreach_errors + 1;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT_OK(uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);
  ASSERT_OK(uv_timer_init(loop, &timer1_handle));
  ASSERT_OK(uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT_OK(uv_timer_init(loop, &timer2_handle));
  ASSERT_OK(uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, timer1_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}